

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
llvm::
SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
::deallocateBuckets(SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                    *this)

{
  if ((undefined1  [24])((undefined1  [24])*this & (undefined1  [24])0x1) == (undefined1  [24])0x0)
  {
    operator_delete(*(void **)(this->storage).buffer,
                    (ulong)*(uint *)((this->storage).buffer + 8) * 2,2);
    if ((undefined1  [24])((undefined1  [24])*this & (undefined1  [24])0x1) != (undefined1  [24])0x0
       ) {
      __assert_fail("!Small",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                    ,0x45b,
                    "const LargeRep *llvm::SmallDenseMap<unsigned short, llvm::detail::DenseSetEmpty, 4, llvm::DenseMapInfo<unsigned short>, llvm::detail::DenseSetPair<unsigned short>>::getLargeRep() const [KeyT = unsigned short, ValueT = llvm::detail::DenseSetEmpty, InlineBuckets = 4, KeyInfoT = llvm::DenseMapInfo<unsigned short>, BucketT = llvm::detail::DenseSetPair<unsigned short>]"
                   );
    }
  }
  return;
}

Assistant:

void deallocateBuckets() {
    if (Small)
      return;

    deallocate_buffer(getLargeRep()->Buckets,
                      sizeof(BucketT) * getLargeRep()->NumBuckets,
                      alignof(BucketT));
    getLargeRep()->~LargeRep();
  }